

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::DOMDocumentImpl::removeNodeIterator
          (DOMDocumentImpl *this,DOMNodeIteratorImpl *nodeIterator)

{
  XMLSize_t XVar1;
  DOMNodeIteratorImpl *pDVar2;
  XMLSize_t getAt;
  
  if ((this->fNodeIterators != (NodeIterators *)0x0) &&
     (XVar1 = (this->fNodeIterators->super_BaseRefVectorOf<xercesc_4_0::DOMNodeIteratorImpl>).
              fCurCount, XVar1 != 0)) {
    getAt = 0;
    do {
      pDVar2 = BaseRefVectorOf<xercesc_4_0::DOMNodeIteratorImpl>::elementAt
                         (&this->fNodeIterators->
                           super_BaseRefVectorOf<xercesc_4_0::DOMNodeIteratorImpl>,getAt);
      if (pDVar2 == nodeIterator) {
        (*(this->fNodeIterators->super_BaseRefVectorOf<xercesc_4_0::DOMNodeIteratorImpl>).
          _vptr_BaseRefVectorOf[4])(this->fNodeIterators,getAt);
        return;
      }
      getAt = getAt + 1;
    } while (XVar1 != getAt);
  }
  return;
}

Assistant:

void DOMDocumentImpl::removeNodeIterator(DOMNodeIteratorImpl* nodeIterator)
{
    if (fNodeIterators != 0) {
        XMLSize_t sz = fNodeIterators->size();
        if (sz !=0) {
            for (XMLSize_t i =0; i<sz; i++) {
                if (fNodeIterators->elementAt(i) == nodeIterator) {
                    fNodeIterators->removeElementAt(i);
                    break;
                }
            }
        }
    }
}